

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall pbrt::Tokenizer::~Tokenizer(Tokenizer *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string asStackY_48 [4];
  int in_stack_ffffffffffffffbc;
  string local_28;
  
  if ((this->unmapPtr != (void *)0x0) && (this->unmapLength != 0)) {
    iVar1 = munmap(this->unmapPtr,this->unmapLength);
    if (iVar1 != 0) {
      LastError();
      ErrorString_abi_cxx11_(in_stack_ffffffffffffffbc);
      StringPrintf<std::__cxx11::string>(&local_28,(pbrt *)"munmap: %s",(char *)asStackY_48,in_RCX);
      std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                (&this->errorCallback,local_28._M_dataplus._M_p,(FileLoc *)0x0);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string(asStackY_48);
    }
  }
  std::__cxx11::string::~string((string *)&this->sEscaped);
  std::__cxx11::string::~string((string *)&this->contents);
  std::_Function_base::~_Function_base(&(this->errorCallback).super__Function_base);
  return;
}

Assistant:

Tokenizer::~Tokenizer() {
#ifdef PBRT_HAVE_MMAP
    if ((unmapPtr != nullptr) && unmapLength > 0)
        if (munmap(unmapPtr, unmapLength) != 0)
            errorCallback(StringPrintf("munmap: %s", ErrorString()).c_str(), nullptr);
#elif defined(PBRT_IS_WINDOWS)
    if (unmapPtr && UnmapViewOfFile(unmapPtr) == 0)
        errorCallback(StringPrintf("UnmapViewOfFile: %s", ErrorString()).c_str(),
                      nullptr);
#endif
}